

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexes.cpp
# Opt level: O3

uint256 * jbcoin::getQualityNext(uint256 *__return_storage_ptr__,uint256 *uBase)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext == '\0') {
    iVar2 = __cxa_guard_acquire(&getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext);
    if (iVar2 != 0) {
      getQualityNext::uNext.pn[4] = 0;
      getQualityNext::uNext.pn[5] = 0;
      getQualityNext::uNext.pn[6] = 0;
      getQualityNext::uNext.pn[7] = 0;
      getQualityNext::uNext.pn[0] = 0;
      getQualityNext::uNext.pn[1] = 0;
      getQualityNext::uNext.pn[2] = 0;
      getQualityNext::uNext.pn[3] = 0;
      base_uint<256UL,_void>::SetHex(&getQualityNext::uNext,"10000000000000000",false);
      __cxa_guard_release(&getQualityNext(jbcoin::base_uint<256ul,void>const&)::uNext);
    }
  }
  local_28 = *(undefined8 *)(uBase->pn + 4);
  uStack_20 = *(undefined8 *)(uBase->pn + 6);
  local_38 = *(undefined8 *)uBase->pn;
  uStack_30 = *(undefined8 *)(uBase->pn + 2);
  lVar3 = 7;
  uVar4 = 0;
  do {
    uVar5 = *(uint *)((long)&local_38 + lVar3 * 4);
    uVar1 = getQualityNext::uNext.pn[lVar3];
    uVar4 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
            + (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) +
              uVar4;
    uVar5 = (uint)uVar4;
    *(uint *)((long)&local_38 + lVar3 * 4) =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar4 = uVar4 >> 0x20;
    bVar6 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar6);
  *(undefined8 *)(__return_storage_ptr__->pn + 4) = local_28;
  *(undefined8 *)(__return_storage_ptr__->pn + 6) = uStack_20;
  *(undefined8 *)__return_storage_ptr__->pn = local_38;
  *(undefined8 *)(__return_storage_ptr__->pn + 2) = uStack_30;
  return __return_storage_ptr__;
}

Assistant:

uint256
getQualityNext (uint256 const& uBase)
{
    static uint256 const uNext (
        from_hex_text<uint256>("10000000000000000"));
    return uBase + uNext;
}